

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

cmList * __thiscall
cmList::transform(cmList *this,TransformAction action,string *arg,
                 unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
                 *selector)

{
  TransformSelector *pTVar1;
  iterator descriptor;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  descriptor = anon_unknown.dwarf_9e8bb::TransformConfigure(action,selector,1);
  (**(code **)(*(long *)descriptor._M_node[2]._M_left + 0x10))
            (descriptor._M_node[2]._M_left,
             (selector->_M_t).
             super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
             .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl,arg);
  pTVar1 = (selector->_M_t).
           super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
           .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl;
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:765:19)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:765:19)>
             ::_M_manager;
  local_40._M_unused._M_object = &descriptor;
  (*pTVar1->_vptr_TransformSelector[5])(pTVar1,this);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  return this;
}

Assistant:

cmList& cmList::transform(TransformAction action, std::string const& arg,
                          std::unique_ptr<TransformSelector> selector)
{
  auto descriptor = TransformConfigure(action, selector, 1);

  descriptor->Transform->Initialize(
    static_cast<::TransformSelector*>(selector.get()), arg);

  static_cast<::TransformSelector&>(*selector).Transform(
    this->Values, [&descriptor](const std::string& s) -> std::string {
      return (*descriptor->Transform)(s);
    });

  return *this;
}